

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O0

int remove_twin_operation_context_from_queue(TWIN_OPERATION_CONTEXT *twin_op_ctx)

{
  char *pcVar1;
  int iVar2;
  LIST_ITEM_HANDLE item;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  LOGGER_LOG l;
  LIST_ITEM_HANDLE list_item;
  int result;
  TWIN_OPERATION_CONTEXT *twin_op_ctx_local;
  
  item = singlylinkedlist_find
                   (twin_op_ctx->msgr->operations,find_twin_operation_by_correlation_id,
                    twin_op_ctx->correlation_id);
  if (item == (LIST_ITEM_HANDLE)0x0) {
    list_item._4_4_ = 0;
  }
  else {
    iVar2 = singlylinkedlist_remove(twin_op_ctx->msgr->operations,item);
    if (iVar2 == 0) {
      list_item._4_4_ = 0;
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar1 = twin_op_ctx->msgr->device_id;
        pcVar4 = TWIN_OPERATION_TYPEStrings(twin_op_ctx->type);
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                  ,"remove_twin_operation_context_from_queue",0x1d9,1,
                  "Failed removing TWIN operation context from queue (%s, %s, %s)",pcVar1,pcVar4,
                  twin_op_ctx->correlation_id);
      }
      list_item._4_4_ = 0x1da;
    }
  }
  return list_item._4_4_;
}

Assistant:

static int remove_twin_operation_context_from_queue(TWIN_OPERATION_CONTEXT* twin_op_ctx)
{
    int result;
    LIST_ITEM_HANDLE list_item;

    if ((list_item = singlylinkedlist_find(twin_op_ctx->msgr->operations, find_twin_operation_by_correlation_id, (const void*)twin_op_ctx->correlation_id)) == NULL)
    {
        result = RESULT_OK;
    }
    else if (singlylinkedlist_remove(twin_op_ctx->msgr->operations, list_item) != 0)
    {
        LogError("Failed removing TWIN operation context from queue (%s, %s, %s)",
            twin_op_ctx->msgr->device_id, MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, twin_op_ctx->type), twin_op_ctx->correlation_id);
        result = MU_FAILURE;
    }
    else
    {
        result = RESULT_OK;
    }

    return result;
}